

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBaseVS::Run(BasicStdLayoutBaseVS *this)

{
  value_type vVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  byte *pbVar8;
  ulong local_c0;
  size_t i;
  undefined1 local_b0 [6];
  bool status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  string local_90;
  allocator<char> local_69;
  string local_68;
  char *local_38;
  char *glsl_vs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data;
  BasicStdLayoutBaseVS *this_local;
  
  in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar3 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  if (bVar3) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
    iVar4 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])
                      (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
    local_38 = (char *)CONCAT44(extraout_var,iVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,(char *)CONCAT44(extraout_var,iVar4),&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"",
               (allocator<char> *)
               ((long)&out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    GVar5 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_68,&local_90);
    this->m_program = GVar5;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar3) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,this->m_buffer);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,sVar6,
                 (allocator<unsigned_char> *)((long)&i + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 7));
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_buffer[1]);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_buffer[0]);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c89);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_buffer[1]);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,0);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,sVar6,pvVar7);
      i._6_1_ = 1;
      local_c0 = 0;
      while( true ) {
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
        if (sVar6 <= local_c0) break;
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs,
                            local_c0);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                            local_c0);
        if (vVar1 != *pvVar7) {
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                              local_c0);
          bVar2 = *pbVar8;
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs,
                              local_c0);
          anon_unknown_0::Output
                    ("Byte at index %3d is %2x should be %2x.\n",local_c0 & 0xffffffff,(ulong)bVar2,
                     (ulong)*pbVar8);
          i._6_1_ = 0;
        }
        local_c0 = local_c0 + 1;
      }
      if ((i._6_1_ & 1) == 0) {
        this_local = (BasicStdLayoutBaseVS *)&DAT_ffffffffffffffff;
      }
      else {
        this_local = (BasicStdLayoutBaseVS *)0x0;
      }
      out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    }
    else {
      this_local = (BasicStdLayoutBaseVS *)&DAT_ffffffffffffffff;
      out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
  }
  else {
    this_local = (BasicStdLayoutBaseVS *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		std::vector<GLubyte> in_data;
		const char*			 glsl_vs = GetInput(in_data);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		// output buffer
		std::vector<GLubyte> out_data(in_data.size());
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &out_data[0], GL_STATIC_DRAW);

		// input buffer
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &in_data[0], GL_STATIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[1]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data.size(), &out_data[0]);

		bool status = true;
		for (size_t i = 0; i < in_data.size(); ++i)
		{
			if (in_data[i] != out_data[i])
			{
				Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i], in_data[i]);
				status = false;
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}